

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void google::InstallFailureSignalHandler(void)

{
  int iVar1;
  ostream *poVar2;
  SendMethod in_R9;
  LogMessage local_130;
  LogMessageVoidify local_c9;
  undefined8 local_c8;
  anon_struct_16_2_a352b0bb kFailureSignal;
  anon_struct_16_2_a352b0bb *__end1;
  anon_struct_16_2_a352b0bb *__begin1;
  anon_struct_16_2_a352b0bb (*__range1) [6];
  sigaction sig_action;
  
  memset(&__range1,0,0x98);
  sigemptyset((sigset_t *)&sig_action);
  sig_action.sa_mask.__val[0xf]._0_4_ = (uint)sig_action.sa_mask.__val[0xf] | 4;
  __range1 = (anon_struct_16_2_a352b0bb (*) [6])anon_unknown_0::FailureSignalHandler;
  kFailureSignal.name = "\x01";
  for (__end1 = (anon_struct_16_2_a352b0bb *)&(anonymous_namespace)::kFailureSignals;
      __end1 != (anon_struct_16_2_a352b0bb *)kFailureSignal.name; __end1 = __end1 + 1) {
    local_c8 = *(undefined8 *)__end1;
    kFailureSignal._0_8_ = __end1->name;
    iVar1 = sigaction((int)local_c8,(sigaction *)&__range1,(sigaction *)0x0);
    if (iVar1 == -1) {
      LogMessageVoidify::LogMessageVoidify(&local_c9);
      ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_130,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/signalhandler.cc"
                 ,0x179,FATAL,0,in_R9);
      poVar2 = LogMessage::stream(&local_130);
      poVar2 = std::operator<<(poVar2,"sigaction(kFailureSignal.number, &sig_action, nullptr)");
      LogMessageVoidify::operator&(&local_c9,poVar2);
      ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_130);
    }
  }
  (anonymous_namespace)::kFailureSignalHandlerInstalled = 1;
  return;
}

Assistant:

void InstallFailureSignalHandler() {
#ifdef HAVE_SIGACTION
  // Build the sigaction struct.
  struct sigaction sig_action;
  memset(&sig_action, 0, sizeof(sig_action));
  sigemptyset(&sig_action.sa_mask);
  sig_action.sa_flags |= SA_SIGINFO;
  sig_action.sa_sigaction = &FailureSignalHandler;

  for (auto kFailureSignal : kFailureSignals) {
    CHECK_ERR(sigaction(kFailureSignal.number, &sig_action, nullptr));
  }
  kFailureSignalHandlerInstalled = true;
#elif defined(GLOG_OS_WINDOWS)
  for (size_t i = 0; i < ARRAYSIZE(kFailureSignals); ++i) {
    CHECK_NE(signal(kFailureSignals[i].number, &FailureSignalHandler), SIG_ERR);
  }
  kFailureSignalHandlerInstalled = true;
#endif  // HAVE_SIGACTION
}